

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

MemRefOpnd * IR::MemRefOpnd::New(void *pMemLoc,IRType type,Func *func,AddrOpndKind addrOpndKind)

{
  MemRefOpnd *this;
  
  this = (MemRefOpnd *)new<Memory::JitArenaAllocator>(0x20,func->m_alloc,0x3d6ef4);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (this->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (this->super_Opnd).m_type = TyIllegal;
  (this->super_Opnd).field_0xb = 0;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  *(undefined2 *)&(this->super_Opnd).field_0xe = 0;
  this->m_memLoc = 0;
  *(undefined8 *)&this->m_addrKind = 0;
  MemRefOpnd(this);
  this->m_memLoc = (intptr_t)pMemLoc;
  (this->super_Opnd).m_type = type;
  (this->super_Opnd).m_kind = OpndKindMemRef;
  this->m_addrKind = addrOpndKind;
  return this;
}

Assistant:

MemRefOpnd *
MemRefOpnd::New(void * pMemLoc, IRType type, Func *func, AddrOpndKind addrOpndKind)
{
    MemRefOpnd * memRefOpnd = JitAnew(func->m_alloc, IR::MemRefOpnd);
    memRefOpnd->m_memLoc = (intptr_t)pMemLoc;
    memRefOpnd->m_type = type;

    memRefOpnd->m_kind = OpndKindMemRef;
#if DBG_DUMP
    memRefOpnd->m_addrKind = addrOpndKind;
#endif

    return memRefOpnd;
}